

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O2

void libtorrent::aux::create_symlink(string *target,string *link,storage_error *ec)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  char buffer [512];
  
  parent_path((string *)buffer,link);
  create_directories((string *)buffer,&ec->ec);
  ::std::__cxx11::string::~string((string *)buffer);
  if ((ec->ec).val_ == 0) {
    iVar2 = symlink((target->_M_dataplus)._M_p,(link->_M_dataplus)._M_p);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      if (iVar2 == 0x11) {
        sVar4 = readlink((link->_M_dataplus)._M_p,buffer,0x200);
        if ((0 < (long)sVar4) &&
           (__y._M_str = buffer, __y._M_len = sVar4, __x._M_str = (target->_M_dataplus)._M_p,
           __x._M_len = target->_M_string_length, bVar1 = ::std::operator!=(__x,__y), !bVar1)) {
          return;
        }
        bVar1 = boost::system::detail::failed_impl
                          (0x11,&boost::system::detail::cat_holder<void>::generic_category_instance.
                                 super_error_category);
        (ec->ec).val_ = 0x11;
      }
      else {
        bVar1 = boost::system::detail::failed_impl
                          (iVar2,&boost::system::detail::cat_holder<void>::generic_category_instance
                                  .super_error_category);
        (ec->ec).val_ = iVar2;
      }
      (ec->ec).failed_ = bVar1;
      (ec->ec).cat_ =
           &boost::system::detail::cat_holder<void>::generic_category_instance.super_error_category;
      ec->operation = symlink;
    }
  }
  else {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    bVar1 = boost::system::detail::failed_impl
                      (iVar2,&boost::system::detail::cat_holder<void>::generic_category_instance.
                              super_error_category);
    (ec->ec).val_ = iVar2;
    (ec->ec).failed_ = bVar1;
    (ec->ec).cat_ =
         &boost::system::detail::cat_holder<void>::generic_category_instance.super_error_category;
    ec->operation = mkdir;
  }
  return;
}

Assistant:

void create_symlink(std::string const& target, std::string const& link, storage_error& ec)
	{
#if TORRENT_HAS_SYMLINK
		create_directories(parent_path(link), ec.ec);
		if (ec)
		{
			ec.ec = error_code(errno, generic_category());
			ec.operation = operation_t::mkdir;
			return;
		}
		if (::symlink(target.c_str(), link.c_str()) != 0)
		{
			int const error = errno;
			if (error == EEXIST)
			{
				// if the file exist, it may be a symlink already. if so,
				// just verify the link target is what it's supposed to be
				// note that readlink() does not null terminate the buffer
				char buffer[512];
				auto const ret = ::readlink(link.c_str(), buffer, sizeof(buffer));
				if (ret <= 0 || target != string_view(buffer, std::size_t(ret)))
				{
					ec.ec = error_code(error, generic_category());
					ec.operation = operation_t::symlink;
					return;
				}
			}
			else
			{
				ec.ec = error_code(error, generic_category());
				ec.operation = operation_t::symlink;
				return;
			}
		}
#else
		TORRENT_UNUSED(target);
		TORRENT_UNUSED(link);
		TORRENT_UNUSED(ec);
#endif
	}